

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O1

void Js::JavascriptObject::CopyDataPropertiesHelper<false,false>
               (Var source,RecyclableObject *to,ScriptContext *scriptContext,
               BVSparse<Memory::Recycler> *excluded)

{
  code *pcVar1;
  RecyclableObject *aValue;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  JavascriptCopyOnAccessNativeIntArray *this;
  RecyclableObject *local_38;
  RecyclableObject *from;
  
  BVar3 = JavascriptOperators::IsObject(to);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x665,"(JavascriptOperators::IsObject(to))",
                                "JavascriptOperators::IsObject(to)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  local_38 = (RecyclableObject *)0x0;
  BVar3 = JavascriptConversion::ToObject(source,scriptContext,&local_38);
  aValue = local_38;
  if (BVar3 == 0) {
    BVar3 = JavascriptOperators::IsUndefinedOrNull(source);
    if (BVar3 == 0) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec36,L"Object.Spread");
    }
  }
  else {
    if (local_38 != (RecyclableObject *)0x0) {
      bVar2 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(local_38);
      if (bVar2) {
        this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(aValue);
      }
      else {
        this = (JavascriptCopyOnAccessNativeIntArray *)0x0;
      }
      if (this != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
        JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
      }
    }
    bVar2 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(local_38);
    if (bVar2) {
      CopyDataPropertiesForProxyObjects<false>(local_38,to,excluded,scriptContext);
    }
    else {
      CopyDataPropertiesForGenericObjects<false>(local_38,to,excluded,scriptContext);
    }
  }
  return;
}

Assistant:

void JavascriptObject::CopyDataPropertiesHelper(Var source, RecyclableObject* to, ScriptContext* scriptContext, const BVSparse<Recycler>* excluded)
{
    // If assign is false, this performs CopyDataProperties(https://tc39.github.io/ecma262/#sec-copydataproperties).
    //    Variable excluded is ignored.
    // Otherwise, it performs the loop body of step 4 in Object.assign (https://tc39.github.io/ecma262/#sec-object.assign).
    //    Value of tryCopy is ignored.
    // 1. Assert Type(to) is Object.
    // 2. Assert Type(excluded) is List.
    // 3. If source is undefined or null, let keys be a new empty List
    // 4. Else,
    //    a. Let from be ToObject(source).
    //    b. Let keys be from.[[OwnpropertyKeys]]().
    // 5. Repeat for each element nextKey of keys in List order,
    //    a. If we are not in assign mode, then
    //        i. Let found be false.
    //        ii. Repeat for each element e of excluded,
    //            1. If e is not empty and SameValue(e, nextKey) is true, then
    //                a. Set found to true.
    //    b. If found is false or we are in assign mode, then
    //        i. Let desc be from.[[GetOwnProperty]](nextKey).
    //        ii. If desc is not undefined and desc.[[Enumerable]] is true, then
    //            1. Let propValue be Get(from, nextKey).
    //            2. If we are in assign mode, then
    //                a. Perform Set(to, nextKey, propValue, true).
    //            3. Else,
    //                a. Perform CreateDataProperty(to, nextKey, propValue).
    // 6. Return target (target is returned in pointer).
    Assert(JavascriptOperators::IsObject(to));
    RecyclableObject* from = nullptr;
    if (!JavascriptConversion::ToObject(source, scriptContext, &from))
    {
        if (JavascriptOperators::IsUndefinedOrNull(source))
        {
            return;
        }
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, GetCopyDataPropertiesEntryName<assign>());
    }

#if ENABLE_COPYONACCESS_ARRAY
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(from);
#endif
    // if proxy, take slow path by calling [[OwnPropertyKeys]] on source
    if (VarIs<JavascriptProxy>(from))
    {
        CopyDataPropertiesForProxyObjects<assign>(from, to, excluded, scriptContext);
    }
    // else use enumerator to extract keys from source
    else
    {
        if (assign)
        {
            bool copied = false;
            if (tryCopy)
            {
                DynamicObject* fromObj = DynamicObject::TryVarToBaseDynamicObject(from);
                DynamicObject* toObj = DynamicObject::TryVarToBaseDynamicObject(to);
                if (toObj && fromObj && toObj->GetType() == scriptContext->GetLibrary()->GetObjectType())
                {
                    copied = toObj->TryCopy(fromObj);
                }
            }
            if (!copied)
            {
                CopyDataPropertiesForGenericObjects<assign>(from, to, /*excluded*/ nullptr, scriptContext);
            }
        }
        else
        {
            CopyDataPropertiesForGenericObjects<assign>(from, to, excluded, scriptContext);
        }
    }
}